

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write_mutex_extension.h
# Opt level: O0

void __thiscall dlib::read_write_mutex::unlock(read_write_mutex *this)

{
  long in_RDI;
  
  mutex::lock((mutex *)0x3caf88);
  if ((*(byte *)(in_RDI + 0x79) & 1) != 0) {
    *(undefined8 *)(in_RDI + 0x70) = *(undefined8 *)(in_RDI + 0x68);
    *(undefined1 *)(in_RDI + 0x79) = 0;
    signaler::broadcast((signaler *)0x3cafad);
  }
  mutex::unlock((mutex *)0x3cafb7);
  return;
}

Assistant:

void unlock (
        ) const
        {
            m.lock();

            // only do something if there really was a lock in place
            if (write_lock_active)
            {
                available_locks = max_locks;
                write_lock_active = false;
                s.broadcast();
            }

            m.unlock();
        }